

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O1

int parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CURLcode CVar6;
  FILE *__stream;
  char *pcVar7;
  uint uVar8;
  size_t len;
  int iVar9;
  bool bVar10;
  uint uVar11;
  char cVar12;
  char *__s;
  dynbuf linebuf;
  dynbuf token;
  char *local_98;
  dynbuf local_88;
  char **local_68;
  char **local_60;
  char *local_58;
  dynbuf local_50;
  
  pcVar1 = *loginp;
  pcVar2 = *passwordp;
  local_68 = loginp;
  local_60 = passwordp;
  local_58 = host;
  Curl_dyn_init(&local_50,0x80);
  if ((store->field_0x28 & 1) == 0) {
    __stream = fopen64(netrcfile,"r");
    Curl_dyn_init(&local_88,0x1000);
    CVar6 = CURLE_OK;
    if ((__stream != (FILE *)0x0) &&
       (iVar5 = Curl_get_line(&local_88,(FILE *)__stream), CVar6 = CURLE_OK, iVar5 != 0)) {
      CVar6 = CURLE_OK;
      do {
        for (pcVar7 = Curl_dyn_ptr(&local_88); (cVar12 = *pcVar7, cVar12 == '\t' || (cVar12 == ' '))
            ; pcVar7 = pcVar7 + 1) {
        }
        if (cVar12 != '#') {
          CVar6 = Curl_dyn_add(&store->filebuf,pcVar7);
          switch(CVar6) {
          case CURLE_OK:
            break;
          default:
            goto switchD_001491f8_default;
          }
        }
        iVar5 = Curl_get_line(&local_88,(FILE *)__stream);
      } while (iVar5 != 0);
    }
switchD_001491f8_default:
    Curl_dyn_free(&local_88);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (CVar6 != CURLE_OK) {
      return -1;
    }
    store->field_0x28 = store->field_0x28 | 1;
  }
  local_98 = Curl_dyn_ptr(&store->filebuf);
  iVar5 = 1;
  iVar9 = 1;
  uVar11 = 0;
  bVar4 = false;
  do {
    pcVar7 = local_98;
    if (bVar4) goto LAB_00149794;
    do {
      if (pcVar7 == (char *)0x0) {
        __s = (char *)0x0;
        goto LAB_00149728;
      }
      Curl_dyn_reset(&local_50);
      do {
        do {
          __s = pcVar7;
          pcVar7 = __s + 1;
          cVar12 = *__s;
        } while (cVar12 == ' ');
      } while (cVar12 == '\t');
      uVar8 = (uint)(cVar12 != '\r') * 3;
      if (cVar12 == '\n') {
        uVar8 = 0;
      }
      if (uVar11 == 3) {
        uVar11 = uVar8;
      }
      if (cVar12 == '\0') {
LAB_001492f1:
        cVar12 = '\x05';
      }
      else if (cVar12 == '\"') {
        if (*pcVar7 == '\0') {
          bVar3 = false;
          bVar10 = false;
        }
        else {
          bVar10 = false;
          bVar3 = false;
          do {
            local_88.bufr._0_1_ = *pcVar7;
            if (bVar3) {
              if ((char)local_88.bufr == 't') {
                local_88.bufr._0_1_ = '\t';
              }
              else if ((char)local_88.bufr == 'r') {
                local_88.bufr._0_1_ = '\r';
              }
              else if ((char)local_88.bufr == 'n') {
                local_88.bufr._0_1_ = '\n';
              }
              bVar3 = false;
LAB_00149368:
              CVar6 = Curl_dyn_addn(&local_50,&local_88,1);
              if (CVar6 == CURLE_OK) {
                pcVar7 = pcVar7 + 1;
                cVar12 = '\0';
              }
              else {
                cVar12 = '\n';
                iVar5 = -1;
                iVar9 = -1;
              }
            }
            else if ((char)local_88.bufr == '\"') {
              pcVar7 = pcVar7 + 1;
              bVar10 = true;
              cVar12 = '\f';
            }
            else {
              if ((char)local_88.bufr != '\\') goto LAB_00149368;
              pcVar7 = pcVar7 + 1;
              bVar3 = true;
              cVar12 = '\v';
            }
            if ((cVar12 != '\0') && (cVar12 != '\v')) {
              if (cVar12 != '\f') goto LAB_00149446;
              break;
            }
          } while (*pcVar7 != '\0');
        }
        if (bVar3) {
          cVar12 = '\n';
          iVar9 = -1;
          iVar5 = -1;
        }
        else {
          iVar9 = iVar5;
          if (!bVar10) {
            iVar9 = -1;
          }
          cVar12 = '\n';
          iVar5 = iVar9;
          if (bVar10) {
            cVar12 = '\0';
          }
        }
LAB_00149446:
        if (cVar12 == '\0') {
LAB_00149454:
          if (((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) ||
             ((pcVar2 == (char *)0x0 || (*pcVar2 == '\0')))) {
            Curl_dyn_ptr(&local_50);
            iVar5 = (*(code *)(&DAT_0017bc14 + *(int *)(&DAT_0017bc14 + (ulong)uVar11 * 4)))();
            return iVar5;
          }
          cVar12 = '\x05';
          bVar4 = true;
        }
      }
      else {
        if (cVar12 == '\n') goto LAB_001492f1;
        len = 0;
        for (pcVar7 = __s;
            ((cVar12 = *pcVar7, cVar12 != '\t' && (cVar12 != ' ')) && ((byte)(cVar12 - 0xeU) < 0xfc)
            ); pcVar7 = pcVar7 + 1) {
          len = len + 1;
        }
        cVar12 = '\n';
        iVar5 = -1;
        if (len == 0) {
          bVar3 = false;
        }
        else {
          CVar6 = Curl_dyn_addn(&local_50,__s,len);
          bVar3 = false;
          if (CVar6 == CURLE_OK) {
            bVar3 = true;
            cVar12 = '\0';
            iVar5 = iVar9;
          }
        }
        iVar9 = iVar5;
        iVar5 = iVar9;
        if (bVar3) goto LAB_00149454;
      }
      pcVar7 = __s;
    } while (cVar12 == '\0');
    if (cVar12 == '\x05') {
LAB_00149728:
      cVar12 = '\0';
      if (!bVar4) {
        if (__s == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = strchr(__s,10);
        }
        if (pcVar7 != (char *)0x0) {
          local_98 = pcVar7 + 1;
        }
        cVar12 = (pcVar7 == (char *)0x0) * '\x03';
      }
    }
  } while (cVar12 == '\0');
  if ((cVar12 == '\n') || (cVar12 == '\x03')) {
LAB_00149794:
    Curl_dyn_free(&local_50);
    if (iVar9 != 0) {
      Curl_dyn_free(&store->filebuf);
    }
  }
  return iVar9;
}

Assistant:

static int parsenetrc(struct store_netrc *store,
                      const char *host,
                      char **loginp,
                      char **passwordp,
                      const char *netrcfile)
{
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;
  enum found_state found = NONE;
  bool our_login = TRUE;  /* With specific_login, found *our* login name (or
                             login-less line) */
  bool done = FALSE;
  char *netrcbuffer;
  struct dynbuf token;
  struct dynbuf *filebuf = &store->filebuf;
  Curl_dyn_init(&token, MAX_NETRC_TOKEN);

  if(!store->loaded) {
    if(file2memory(netrcfile, filebuf))
      return NETRC_FAILED;
    store->loaded = TRUE;
  }

  netrcbuffer = Curl_dyn_ptr(filebuf);

  while(!done) {
    char *tok = netrcbuffer;
    while(tok) {
      char *tok_end;
      bool quoted;
      Curl_dyn_reset(&token);
      while(ISBLANK(*tok))
        tok++;
      /* tok is first non-space letter */
      if(state == MACDEF) {
        if((*tok == '\n') || (*tok == '\r'))
          state = NOTHING; /* end of macro definition */
      }

      if(!*tok || (*tok == '\n'))
        /* end of line  */
        break;

      /* leading double-quote means quoted string */
      quoted = (*tok == '\"');

      tok_end = tok;
      if(!quoted) {
        size_t len = 0;
        while(!ISSPACE(*tok_end)) {
          tok_end++;
          len++;
        }
        if(!len || Curl_dyn_addn(&token, tok, len)) {
          retcode = NETRC_FAILED;
          goto out;
        }
      }
      else {
        bool escape = FALSE;
        bool endquote = FALSE;
        tok_end++; /* pass the leading quote */
        while(*tok_end) {
          char s = *tok_end;
          if(escape) {
            escape = FALSE;
            switch(s) {
            case 'n':
              s = '\n';
              break;
            case 'r':
              s = '\r';
              break;
            case 't':
              s = '\t';
              break;
            }
          }
          else if(s == '\\') {
            escape = TRUE;
            tok_end++;
            continue;
          }
          else if(s == '\"') {
            tok_end++; /* pass the ending quote */
            endquote = TRUE;
            break;
          }
          if(Curl_dyn_addn(&token, &s, 1)) {
            retcode = NETRC_FAILED;
            goto out;
          }
          tok_end++;
        }
        if(escape || !endquote) {
          /* bad syntax, get out */
          retcode = NETRC_FAILED;
          goto out;
        }
      }

      if((login && *login) && (password && *password)) {
        done = TRUE;
        break;
      }

      tok = Curl_dyn_ptr(&token);

      switch(state) {
      case NOTHING:
        if(strcasecompare("macdef", tok))
          /* Define a macro. A macro is defined with the specified name; its
             contents begin with the next .netrc line and continue until a
             null line (consecutive new-line characters) is encountered. */
          state = MACDEF;
        else if(strcasecompare("machine", tok))
          /* the next tok is the machine name, this is in itself the delimiter
             that starts the stuff entered for this machine, after this we
             need to search for 'login' and 'password'. */
          state = HOSTFOUND;
        else if(strcasecompare("default", tok)) {
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        break;
      case MACDEF:
        if(!*tok)
          state = NOTHING;
        break;
      case HOSTFOUND:
        if(strcasecompare(host, tok)) {
          /* and yes, this is our host! */
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        else
          /* not our host */
          state = NOTHING;
        break;
      case HOSTVALID:
        /* we are now parsing sub-keywords concerning "our" host */
        if(found == LOGIN) {
          if(specific_login) {
            our_login = !Curl_timestrcmp(login, tok);
          }
          else if(!login || Curl_timestrcmp(login, tok)) {
            if(login_alloc)
              free(login);
            login = strdup(tok);
            if(!login) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            login_alloc = TRUE;
          }
          found = NONE;
        }
        else if(found == PASSWORD) {
          if((our_login || !specific_login) &&
             (!password || Curl_timestrcmp(password, tok))) {
            if(password_alloc)
              free(password);
            password = strdup(tok);
            if(!password) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            password_alloc = TRUE;
          }
          found = NONE;
        }
        else if(strcasecompare("login", tok))
          found = LOGIN;
        else if(strcasecompare("password", tok))
          found = PASSWORD;
        else if(strcasecompare("machine", tok)) {
          /* ok, there is machine here go => */
          state = HOSTFOUND;
          found = NONE;
        }
        break;
      } /* switch (state) */
      tok = ++tok_end;
    }
    if(!done) {
      char *nl = NULL;
      if(tok)
        nl = strchr(tok, '\n');
      if(!nl)
        break;
      /* point to next line */
      netrcbuffer = &nl[1];
    }
  } /* while !done */

out:
  Curl_dyn_free(&token);
  if(!retcode) {
    /* success */
    if(login_alloc) {
      free(*loginp);
      *loginp = login;
    }
    if(password_alloc) {
      free(*passwordp);
      *passwordp = password;
    }
  }
  else {
    Curl_dyn_free(filebuf);
    if(login_alloc)
      free(login);
    if(password_alloc)
      free(password);
  }

  return retcode;
}